

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O3

Interval * tcu::operator+(Interval *__return_storage_ptr__,Interval *x,Interval *y)

{
  bool bVar1;
  double dVar2;
  deRoundingMode mode;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  dVar3 = INFINITY;
  dVar5 = -INFINITY;
  if ((x->m_lo < x->m_hi || x->m_lo == x->m_hi) && (y->m_lo < y->m_hi || y->m_lo == y->m_hi)) {
    mode = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    dVar5 = x->m_lo;
    dVar3 = y->m_lo;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    dVar5 = dVar5 + dVar3;
    bVar1 = NAN(dVar5);
    dVar2 = -INFINITY;
    if (!bVar1) {
      dVar2 = dVar5;
    }
    dVar3 = INFINITY;
    if (!bVar1) {
      dVar3 = dVar5;
    }
    dVar6 = x->m_hi + y->m_hi;
    dVar5 = -INFINITY;
    dVar4 = INFINITY;
    if (!NAN(dVar6)) {
      dVar5 = dVar6;
      dVar4 = dVar6;
    }
    dVar3 = (double)(~-(ulong)(dVar3 <= dVar4) & (ulong)dVar4 |
                    (ulong)dVar3 & -(ulong)(dVar3 <= dVar4));
    dVar5 = (double)(~-(ulong)(dVar5 <= dVar2) & (ulong)dVar5 |
                    (ulong)dVar2 & -(ulong)(dVar5 <= dVar2));
    __return_storage_ptr__->m_hasNaN = bVar1 || NAN(dVar6);
    __return_storage_ptr__->m_lo = dVar3;
    __return_storage_ptr__->m_hi = dVar5;
    deSetRoundingMode(mode);
  }
  if ((x->m_hasNaN != false) || (y->m_hasNaN == true)) {
    __return_storage_ptr__->m_hasNaN = true;
    __return_storage_ptr__->m_lo = dVar3;
    __return_storage_ptr__->m_hi = dVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

Interval operator+ (const Interval& x, const Interval& y)
{
	Interval ret;

	if (!x.empty() && !y.empty())
		TCU_SET_INTERVAL_BOUNDS(ret, p, p = x.lo() + y.lo(), p = x.hi() + y.hi());
	if (x.hasNaN() || y.hasNaN())
		ret |= TCU_NAN;

	return ret;
}